

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

shared_ptr<tinygraph::Vertex> __thiscall
tinygraph::Graph::add(Graph *this,string *name,shared_ptr<tinygraph::Type> *type)

{
  shared_ptr<tinygraph::Type> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<tinygraph::Vertex> sVar1;
  shared_ptr<tinygraph::Vertex> local_60 [2];
  shared_ptr<tinygraph::Type> local_40;
  undefined1 local_29;
  shared_ptr<tinygraph::Type> *type_local;
  string *name_local;
  Graph *this_local;
  shared_ptr<tinygraph::Vertex> *v;
  
  local_29 = 0;
  type_local = type;
  name_local = name;
  this_local = this;
  std::shared_ptr<tinygraph::Type>::shared_ptr(&local_40,in_RCX);
  vertex_create((string *)this,type);
  std::shared_ptr<tinygraph::Type>::~shared_ptr(&local_40);
  std::shared_ptr<tinygraph::Vertex>::shared_ptr(local_60,(shared_ptr<tinygraph::Vertex> *)this);
  add_vertex((Graph *)name,local_60);
  std::shared_ptr<tinygraph::Vertex>::~shared_ptr(local_60);
  sVar1.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tinygraph::Vertex>)
         sVar1.super___shared_ptr<tinygraph::Vertex,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Vertex> Graph::add(const std::string &name, std::shared_ptr<Type> type) {
        auto v = vertex_create(name, std::move(type));
        this->add_vertex(v);
        return v;
    }